

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O3

void __thiscall ScapeGoatTree::caseC(ScapeGoatTree *this,Node *par,Node *loc)

{
  Node *ptrSave;
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar3 = loc->rightChild;
  pNVar1 = loc;
  do {
    pNVar2 = pNVar1;
    pNVar1 = pNVar3;
    pNVar3 = pNVar1->leftChild;
  } while (pNVar1->leftChild != (Node *)0x0);
  pNVar3 = (Node *)&pNVar2->leftChild;
  if (pNVar2->leftChild != pNVar1) {
    pNVar3 = pNVar2;
  }
  pNVar3->rightChild = pNVar1->rightChild;
  if ((par != (Node *)0x0) && (this = (ScapeGoatTree *)&par->leftChild, par->leftChild != loc)) {
    this = (ScapeGoatTree *)par;
  }
  ((Node *)this)->rightChild = pNVar1;
  pNVar3 = loc->leftChild;
  pNVar1->rightChild = loc->rightChild;
  pNVar1->leftChild = pNVar3;
  return;
}

Assistant:

void ScapeGoatTree::caseC(Node *par, Node *loc) {
    Node *ptr, *ptrSave, *suc, *parSuc;
    ptrSave = loc;
    ptr = loc->rightChild;
    while (ptr->leftChild != nullptr) {
        ptrSave = ptr;
        ptr = ptr->leftChild;
    }
    suc = ptr;
    parSuc = ptrSave;
    if (suc->leftChild == nullptr && suc->rightChild == nullptr) {
        caseA(parSuc, suc);
    } else {
        caseB(parSuc, suc);
    }
    if (par == nullptr) {
        root = suc;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = suc;
        } else {
            par->rightChild = suc;
        }
    }
    suc->leftChild = loc->leftChild;
    suc->rightChild = loc->rightChild;
}